

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessTools.h
# Opt level: O0

void __thiscall cmProcessTools::OutputLogger::~OutputLogger(OutputLogger *this)

{
  OutputLogger *this_local;
  
  ~OutputLogger(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

OutputLogger(std::ostream& log, const char* prefix = nullptr)
    {
      this->SetLog(&log, prefix);
    }